

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::Field::ByteSizeLong(Field *this)

{
  long lVar1;
  Rep *pRVar2;
  string *psVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  void **ppvVar7;
  
  sVar6 = (size_t)(this->options_).super_RepeatedPtrFieldBase.current_size_;
  pRVar2 = (this->options_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  lVar1 = sVar6 * 8;
  for (lVar5 = 0; lVar1 - lVar5 != 0; lVar5 = lVar5 + 8) {
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::Option>
                      (*(Option **)((long)ppvVar7 + lVar5));
    sVar6 = sVar6 + sVar4;
  }
  psVar3 = (this->name_).ptr_;
  if (psVar3->_M_string_length != 0) {
    sVar4 = internal::WireFormatLite::StringSize(psVar3);
    sVar6 = sVar6 + sVar4 + 1;
  }
  psVar3 = (this->type_url_).ptr_;
  if (psVar3->_M_string_length != 0) {
    sVar4 = internal::WireFormatLite::StringSize(psVar3);
    sVar6 = sVar6 + sVar4 + 1;
  }
  psVar3 = (this->json_name_).ptr_;
  if (psVar3->_M_string_length != 0) {
    sVar4 = internal::WireFormatLite::StringSize(psVar3);
    sVar6 = sVar6 + sVar4 + 1;
  }
  psVar3 = (this->default_value_).ptr_;
  if (psVar3->_M_string_length != 0) {
    sVar4 = internal::WireFormatLite::StringSize(psVar3);
    sVar6 = sVar6 + sVar4 + 1;
  }
  if (this->kind_ != 0) {
    sVar4 = io::CodedOutputStream::VarintSize32SignExtended(this->kind_);
    sVar6 = sVar6 + sVar4 + 1;
  }
  if (this->cardinality_ != 0) {
    sVar4 = io::CodedOutputStream::VarintSize32SignExtended(this->cardinality_);
    sVar6 = sVar6 + sVar4 + 1;
  }
  if (this->number_ != 0) {
    sVar4 = io::CodedOutputStream::VarintSize32SignExtended(this->number_);
    sVar6 = sVar6 + sVar4 + 1;
  }
  if (this->oneof_index_ != 0) {
    sVar4 = io::CodedOutputStream::VarintSize32SignExtended(this->oneof_index_);
    sVar6 = sVar6 + sVar4 + 1;
  }
  sVar4 = sVar6 + 2;
  if (this->packed_ == false) {
    sVar4 = sVar6;
  }
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict2)sVar4;
    return sVar4;
  }
  sVar6 = internal::ComputeUnknownFieldsSize
                    (&(this->super_Message).super_MessageLite._internal_metadata_,sVar4,
                     &this->_cached_size_);
  return sVar6;
}

Assistant:

size_t Field::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.Field)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.Option options = 9;
  total_size += 1UL * this->_internal_options_size();
  for (const auto& msg : this->options_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // string name = 4;
  if (this->name().size() > 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_name());
  }

  // string type_url = 6;
  if (this->type_url().size() > 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_type_url());
  }

  // string json_name = 10;
  if (this->json_name().size() > 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_json_name());
  }

  // string default_value = 11;
  if (this->default_value().size() > 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_default_value());
  }

  // .google.protobuf.Field.Kind kind = 1;
  if (this->kind() != 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_kind());
  }

  // .google.protobuf.Field.Cardinality cardinality = 2;
  if (this->cardinality() != 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_cardinality());
  }

  // int32 number = 3;
  if (this->number() != 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
        this->_internal_number());
  }

  // int32 oneof_index = 7;
  if (this->oneof_index() != 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
        this->_internal_oneof_index());
  }

  // bool packed = 8;
  if (this->packed() != 0) {
    total_size += 1 + 1;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}